

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_log.c
# Opt level: O3

int mpt_connection_log(mpt_connection *con,char *from,int type,char *msg)

{
  int iVar1;
  ssize_t sVar3;
  long lVar4;
  int iVar5;
  size_t len;
  int8_t hdr [4];
  undefined1 local_3c;
  byte local_3b;
  undefined1 local_3a;
  size_t local_38;
  size_t sVar2;
  
  if (((con->out).state & 0x10) != 0) {
    return -0x21;
  }
  local_3c = 0;
  local_3b = (byte)type & 0x7f;
  len = 2;
  local_38 = 0;
  if (from == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    sVar2 = strlen(from);
    iVar1 = (int)sVar2;
    if (((uint)type >> 0xb & 1) != 0) {
      local_3a = 1;
      len = 3;
    }
  }
  if (msg == (char *)0x0) {
    lVar4 = 0x100;
  }
  else {
    local_38 = strlen(msg);
    lVar4 = 0xfe;
  }
  sVar3 = 0xffffffef;
  if (((long)(lVar4 - len) <= (long)iVar1) ||
     (sVar3 = mpt_connection_push(con,len,&local_3c), sVar3 < 0)) goto LAB_001051ea;
  iVar5 = 0x100 - (int)len;
  if (from != (char *)0x0) {
    mpt_connection_push(con,(long)iVar1,from);
    iVar5 = iVar5 - iVar1;
  }
  sVar2 = local_38;
  if (msg == (char *)0x0) {
LAB_001051b4:
    mpt_connection_push(con,0,(void *)0x0);
    sVar3 = 2;
    if (iVar5 != 0) goto LAB_001051ea;
  }
  else {
    local_3c = 2;
    mpt_connection_push(con,1,&local_3c);
    iVar5 = iVar5 + -1;
    if ((int)sVar2 < iVar5) {
      mpt_connection_push(con,(long)(int)sVar2,msg);
      local_3c = 3;
      mpt_connection_push(con,1,&local_3c);
      goto LAB_001051b4;
    }
    mpt_connection_push(con,(long)iVar5,msg);
    mpt_connection_push(con,0,(void *)0x0);
  }
  sVar3 = 1;
LAB_001051ea:
  return (int)sVar3;
}

Assistant:

extern int mpt_connection_log(MPT_STRUCT(connection) *con, const char *from, int type, const char *msg)
{
	int8_t hdr[4];
	int flen, mlen, len;
	ssize_t ret;
	
	/* send log entry to contact */
	if ((con->out.state & MPT_OUTFLAG(Active))) {
		return MPT_MESGERR(InProgress);
	}
	hdr[0] = MPT_MESGTYPE(Output);
	hdr[1] = type & 0x7f;
	
	len = 2;
	mlen = flen = 0;
	if (from) {
		flen = strlen(from);
		if (type & MPT_ENUM(LogFunction)) {
			hdr[len++] = 0x1; /* SOH */
		}
	}
	ret = MPT_OUTPUT_LOGMSG_MAX;
	if (msg) {
		mlen = strlen(msg);
		ret -= 2;
	}
	if (flen >= (ret - len)) {
		return MPT_ERROR(MissingBuffer);
	}
	if ((ret = mpt_connection_push(con, len, hdr)) < 0) {
		return ret;
	}
	len = MPT_OUTPUT_LOGMSG_MAX - len;
	if (from) {
		mpt_connection_push(con, flen, from);
		len -= flen;
	}
	if (msg) {
		*hdr = 0x2; /* STX */
		mpt_connection_push(con, 1, hdr);
		--len;
		
		if (len > mlen) {
			mpt_connection_push(con, mlen, msg);
			*hdr = 0x3; /* ETX */
			mpt_connection_push(con, 1, hdr);
		} else {
			mpt_connection_push(con, len, msg);
			len = 0;
		}
	}
	mpt_connection_push(con, 0, 0);
	
	return len ? 2 : 1;
}